

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_ctr.c
# Opt level: O3

void beltCTRStart(void *state,octet *key,size_t len,octet *iv)

{
  beltKeyExpand2((u32 *)state,key,len);
  u32From((u32 *)((long)state + 0x20),iv,0x10);
  beltBlockEncr2((u32 *)((long)state + 0x20),(u32 *)state);
  *(undefined8 *)((long)state + 0x40) = 0;
  return;
}

Assistant:

void beltCTRStart(void* state, const octet key[], size_t len, 
	const octet iv[16])
{
	belt_ctr_st* st = (belt_ctr_st*)state;
	ASSERT(memIsDisjoint2(iv, 16, state, beltCTR_keep()));
	beltKeyExpand2(st->key, key, len);
	u32From(st->ctr, iv, 16);
	beltBlockEncr2(st->ctr, st->key);
	st->reserved = 0;
}